

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_lzma_varint(uchar *compressed,size_t compressed_size,size_t *poffset,uint64_t *val)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = *poffset;
  iVar1 = 0;
  uVar3 = 0;
  while( true ) {
    if (compressed_size <= sVar2) {
      return 0;
    }
    uVar3 = uVar3 | (long)(int)((compressed[sVar2] & 0x7f) << ((byte)iVar1 & 0x1f));
    if (-1 < (char)compressed[sVar2]) break;
    iVar1 = iVar1 + 7;
    sVar2 = sVar2 + 1;
    if (iVar1 == 0x3f) {
      return 0;
    }
  }
  *poffset = sVar2 + 1;
  *val = uVar3;
  return 1;
}

Assistant:

static int
elf_lzma_varint (const unsigned char *compressed, size_t compressed_size,
		 size_t *poffset, uint64_t *val)
{
  size_t off;
  int i;
  uint64_t v;
  unsigned char b;

  off = *poffset;
  i = 0;
  v = 0;
  while (1)
    {
      if (unlikely (off >= compressed_size))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      b = compressed[off];
      v |= (b & 0x7f) << (i * 7);
      ++off;
      if ((b & 0x80) == 0)
	{
	  *poffset = off;
	  *val = v;
	  return 1;
	}
      ++i;
      if (unlikely (i >= 9))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }
}